

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myentity.hpp
# Opt level: O1

void __thiscall MyEntity::MyEntity(MyEntity *this,MyEntity *obj)

{
  undefined8 uVar1;
  
  MetaSim::Entity::Entity(&this->super_Entity,&obj->super_Entity);
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR__MyEntity_0017c5d8;
  MetaSim::Event::Event(&(this->eventA).super_Event,&(obj->eventA).super_Event);
  (this->eventA).super_Event._vptr_Event = (_func_int **)&PTR__Event_0017c620;
  (this->eventA)._obj = this;
  uVar1 = *(undefined8 *)&(obj->eventA).field_0x98;
  (this->eventA)._fun = (obj->eventA)._fun;
  *(undefined8 *)&(this->eventA).field_0x98 = uVar1;
  MetaSim::Event::Event(&(this->eventB).super_Event,&(obj->eventB).super_Event);
  (this->eventB).super_Event._vptr_Event = (_func_int **)&PTR__Event_0017c620;
  (this->eventB)._obj = this;
  uVar1 = *(undefined8 *)&(obj->eventB).field_0x98;
  (this->eventB)._fun = (obj->eventB)._fun;
  *(undefined8 *)&(this->eventB).field_0x98 = uVar1;
  MetaSim::Event::Event(&(this->eventC).super_Event,&(obj->eventC).super_Event);
  (this->eventC).super_Event._vptr_Event = (_func_int **)&PTR__Event_0017c620;
  (this->eventC)._obj = this;
  uVar1 = *(undefined8 *)&(obj->eventC).field_0x98;
  (this->eventC)._fun = (obj->eventC)._fun;
  *(undefined8 *)&(this->eventC).field_0x98 = uVar1;
  return;
}

Assistant:

MyEntity(const MyEntity &obj) :
        Entity(obj),
        eventA(obj.eventA, *this),
        eventB(obj.eventB, *this),
        eventC(obj.eventC, *this)
        {}